

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  TDrawFunction TVar2;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  runtime_error *this_01;
  size_type *psVar8;
  long lVar9;
  CColorArray coords;
  CElementArray elements;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray bufferTest;
  DrawElementsIndirectCommand indirectElements;
  CColorArray bufferRef;
  GLchar *varyings [1];
  DIResult result;
  CColorArray local_3d8;
  string local_3b8;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_380;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined4 local_358;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_348;
  char *local_330;
  undefined1 local_328 [8];
  _func_int **pp_Stack_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [23];
  long local_1a8;
  undefined1 local_1a0 [384];
  
  local_3d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::PrimitiveGen
            ((DrawIndirectBase *)this,4,(this->super_CBasicXFBPausedDef)._drawSizeX,
             (this->super_CBasicXFBPausedDef)._drawSizeY,&local_3d8);
  local_318[0]._M_local_buf[0] = '#';
  local_318[0]._M_allocated_capacity._1_6_ = 0x6f6973726576;
  local_318[0]._M_local_buf[7] = 'n';
  local_318[0]._8_7_ = 0x73652030313320;
  pp_Stack_320 = (_func_int **)0xf;
  local_318[0]._M_local_buf[0xf] = '\0';
  local_328 = (undefined1  [8])local_318;
  plVar6 = (long *)std::__cxx11::string::append(local_328);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    local_1a0._16_8_ = *psVar8;
    local_1a0._24_8_ = plVar6[3];
    local_1a0._0_8_ = local_1a0 + 0x10;
  }
  else {
    local_1a0._16_8_ = *psVar8;
    local_1a0._0_8_ = (size_type *)*plVar6;
  }
  local_1a0._8_8_ = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT17(local_318[0]._M_local_buf[7],
                             CONCAT61(local_318[0]._M_allocated_capacity._1_6_,
                                      local_318[0]._M_local_buf[0])) + 1);
  }
  pp_Stack_320 = (_func_int **)0x0;
  local_318[0]._M_local_buf[0] = '\0';
  local_328 = (undefined1  [8])local_318;
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar3 = DrawIndirectBase::CreateProgram
                    ((DrawIndirectBase *)this,(string *)local_1a0,(string *)local_328,&local_3b8,
                     false);
  (this->super_CBasicXFBPausedDef)._program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT17(local_318[0]._M_local_buf[7],
                             CONCAT61(local_318[0]._M_allocated_capacity._1_6_,
                                      local_318[0]._M_local_buf[0])) + 1);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_330 = "dataOut";
  this_00 = &(this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (this_00,(this->super_CBasicXFBPausedDef)._program,1,&local_330,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,(this->super_CBasicXFBPausedDef)._program);
  lVar7 = DrawIndirectBase::CheckProgram
                    ((DrawIndirectBase *)this,(this->super_CBasicXFBPausedDef)._program);
  if (lVar7 == 0) {
    lVar7 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,(this->super_CBasicXFBPausedDef)._program);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._vbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*pGVar1);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3d8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3d8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               local_3d8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._vao;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindVertexArray(this_00,*pGVar1);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_398 = 0;
    uStack_394 = 0;
    uStack_390 = 0;
    uStack_38c = 0;
    local_358 = 0;
    local_368 = 0;
    uStack_364 = 0;
    uStack_360 = 0;
    uStack_35c = 0;
    local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3b8,
               (long)local_3d8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3d8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,
               (value_type_conflict4 *)local_328,(allocator_type *)local_1a0);
    if (local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p != 0) {
      lVar7 = (long)(local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p) >> 2;
      lVar9 = 0;
      do {
        *(int *)(local_3b8._M_dataplus._M_p + lVar9 * 4) = (int)lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
    }
    pGVar1 = &(this->super_CBasicXFBPausedDef)._xfo;
    glu::CallLogWrapper::glGenTransformFeedbacks(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,*pGVar1);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._xfbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x400,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*pGVar1);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    glu::CallLogWrapper::glPauseTransformFeedback(this_00);
    TVar2 = (this->super_CBasicXFBPausedDef)._drawFunc;
    if (TVar2 == DRAW_ARRAYS) {
      local_398 = (undefined4)
                  ((ulong)((long)local_3d8.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_3d8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uStack_394 = 1;
      uStack_390 = 0;
      uStack_38c = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_328);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,local_328._0_4_);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,&local_398,0x88e4);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_328);
    }
    else {
      if (TVar2 != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_368 = (undefined4)
                  ((ulong)((long)local_3d8.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_3d8.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uStack_364 = 1;
      uStack_360 = 0;
      uStack_35c = 0;
      local_358 = 0;
      pGVar1 = &(this->super_CBasicXFBPausedDef)._ebo;
      glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,*pGVar1);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p,
                 local_3b8._M_dataplus._M_p,0x88e4);
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)local_328);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,local_328._0_4_);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_368,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)local_328);
    }
    glu::CallLogWrapper::glResumeTransformFeedback(this_00);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    local_328 = (undefined1  [8])0x3e4ccccd3dcccccd;
    pp_Stack_320 = (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_348,(long)(iVar4 * *(int *)(CONCAT44(extraout_var_00,iVar5) + 4)),
               (value_type *)local_328,(allocator_type *)local_1a0);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    local_328 = (undefined1  [8])0x0;
    pp_Stack_320 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_380,(long)(iVar4 * *(int *)(CONCAT44(extraout_var_02,iVar5) + 4)),
               (value_type *)local_328,(allocator_type *)local_1a0);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_03,iVar4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              ((DrawIndirectBase *)this,0,0,iVar4,*(int *)(CONCAT44(extraout_var_04,iVar5) + 4),
               local_380.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_320);
    local_1a8 = 0;
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar4);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar4) + 4);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar4);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_380,widthTest,heightTest,&local_348,widthRef,
                       *(uint *)(CONCAT44(extraout_var_08,iVar4) + 4));
    DIResult::sub_result((DILogger *)local_1a0,(DIResult *)local_328,lVar7);
    DILogger::~DILogger((DILogger *)local_1a0);
    lVar7 = local_1a8;
    DILogger::~DILogger((DILogger *)local_328);
    if (local_380.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_380.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_380.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_380.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_348.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3b8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      local_3b8.field_2._M_allocated_capacity - (long)local_3b8._M_dataplus._M_p);
    }
  }
  if (local_3d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		return CBasicXFBPausedDef::Run<api>();
	}